

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<long,int,int(*)(char_const**,long*)>
               (int num1,_func_int_char_ptr_ptr_long_ptr *read_f,bool is_ok)

{
  mp_type mVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  byte *pbVar6;
  byte bVar7;
  undefined1 *puVar8;
  code *pcVar9;
  char (*pacVar10) [16];
  char (*pacVar11) [16];
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  float fVar12;
  uint extraout_EDX_01;
  char *pcVar13;
  double dVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  undefined8 *puVar18;
  char *pcVar19;
  byte *pbVar20;
  uint *val;
  char (*pacVar21) [16];
  char cVar22;
  char *pcVar23;
  undefined8 uVar24;
  char *pcVar25;
  long lVar26;
  char *pcVar27;
  undefined8 *puVar28;
  ulong uVar29;
  undefined1 *puVar30;
  char *pcVar31;
  undefined *puVar32;
  undefined1 *puVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_1088;
  undefined1 *puStack_1080;
  char acStack_1078 [256];
  undefined1 uStack_f78;
  undefined8 uStack_f77;
  undefined1 auStack_f6f [255];
  char (*pacStack_e70) [16];
  undefined8 uStack_e68;
  undefined *puStack_e60;
  code *pcStack_e58;
  double dStack_e50;
  byte *pbStack_e48;
  char acStack_e40 [256];
  byte abStack_d40 [16];
  byte abStack_d30 [248];
  long lStack_c38;
  ulong uStack_c30;
  char *pcStack_c28;
  char *pcStack_c20;
  char *pcStack_c18;
  code *pcStack_c10;
  char (*pacStack_c08) [16];
  char *pcStack_c00;
  float fStack_bf8;
  undefined4 uStack_bf4;
  double dStack_bf0;
  double dStack_be8;
  char (*pacStack_be0) [16];
  char acStack_bd8 [256];
  byte bStack_ad8;
  undefined8 uStack_ad7;
  char acStack_acf [255];
  long lStack_9d0;
  ulong uStack_9c8;
  char *pcStack_9c0;
  char *pcStack_9b8;
  char *pcStack_9b0;
  code *pcStack_9a8;
  char (*pacStack_9a0) [16];
  char *pcStack_998;
  float fStack_990;
  undefined4 uStack_98c;
  double dStack_988;
  double dStack_980;
  code *pcStack_978;
  byte bStack_970;
  undefined8 uStack_96f;
  char acStack_967 [247];
  char acStack_870 [256];
  undefined1 auStack_770 [8];
  undefined8 *puStack_768;
  ulong uStack_760;
  undefined8 *puStack_758;
  long lStack_750;
  undefined1 *puStack_748;
  code *pcStack_740;
  code *pcStack_738;
  float fStack_72c;
  double dStack_728;
  double dStack_720;
  undefined8 *puStack_718;
  char (*pacStack_710) [16];
  byte bStack_708;
  undefined1 auStack_707 [2];
  undefined1 auStack_705 [6];
  undefined8 auStack_6ff [30];
  char acStack_608 [256];
  undefined1 auStack_508 [8];
  char (*pacStack_500) [16];
  char *pcStack_4f8;
  char *pcStack_4f0;
  char (*pacStack_4e8) [16];
  long lStack_4e0;
  code *pcStack_4d8;
  float fStack_4c4;
  char (*pacStack_4c0) [16];
  int iStack_4b4;
  double dStack_4b0;
  double dStack_4a8;
  byte bStack_4a0;
  undefined8 uStack_49f;
  char acStack_497 [247];
  char acStack_3a0 [256];
  undefined1 auStack_2a0 [8];
  ulong uStack_298;
  char *pcStack_290;
  long lStack_288;
  undefined1 *puStack_280;
  undefined1 *puStack_278;
  code *pcStack_270;
  int local_25c;
  ulong local_258;
  float local_24c;
  ulong local_248;
  double local_240;
  byte local_238;
  undefined8 local_237;
  undefined1 local_22f [247];
  char local_138 [256];
  char local_38 [8];
  
  builtin_strncpy(local_138,"typed read of ",0xf);
  uVar29 = (ulong)num1;
  if (num1 < 0) {
    pcVar13 = "%lld";
    uVar16 = uVar29;
  }
  else {
    pcVar13 = "%llu";
    uVar16 = (ulong)(uint)num1;
  }
  pcStack_270 = (code *)0x137c8b;
  local_25c = num1;
  iVar2 = snprintf(local_138 + 0xe,0xf2,pcVar13,uVar16);
  pcVar25 = local_138 + 0xe + iVar2;
  iVar3 = 0;
  pcStack_270 = (code *)0x137ca9;
  iVar2 = snprintf(pcVar25,(size_t)(local_38 + -(long)pcVar25)," into ");
  pcVar13 = local_38 + -(long)(pcVar25 + iVar2);
  pcStack_270 = (code *)0x137cc8;
  snprintf(pcVar25 + iVar2,(size_t)pcVar13,"int%zu_t",0x40);
  pcStack_270 = (code *)0x137cd7;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x137cf0;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x137d00;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x137d0d;
  fputc(10,_stdout);
  if (-1 < local_25c) {
    pcStack_270 = (code *)0x137d21;
    iVar3 = test_encode_uint_all_sizes((char (*) [16])&local_238,(ulong)(uint)num1);
  }
  pacVar11 = (char (*) [16])(&local_238 + (long)iVar3 * 0x10);
  pcStack_270 = (code *)0x137d3d;
  iVar2 = test_encode_int_all_sizes(pacVar11,uVar29);
  uVar15 = iVar3 + iVar2;
  if (uVar15 != 0 && SCARRY4(iVar3,iVar2) == (int)uVar15 < 0) {
    local_24c = (float)local_25c;
    local_240 = (double)local_25c;
    local_248 = (ulong)uVar15;
    puVar33 = (undefined1 *)((long)&local_237 + 1);
    lVar26 = 0;
    local_258 = uVar29;
    do {
      lVar5 = lVar26 * 0x10;
      puVar8 = puVar33 + -2;
      bVar7 = puVar33[-2];
      uVar29 = (ulong)bVar7;
      uVar16 = (ulong)(char)bVar7;
      mVar1 = mp_type_hint[uVar29];
      puVar30 = puVar33;
      if (mVar1 != MP_UINT) {
        if (mVar1 == MP_FLOAT) {
          if (bVar7 != 0xca) goto LAB_0013809f;
          uVar15 = *(uint *)(puVar33 + -1);
          fVar12 = (float)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                          uVar15 << 0x18);
          if ((fVar12 != local_24c) || (NAN(fVar12) || NAN(local_24c))) {
            pcStack_270 = (code *)0x1380c3;
            test_read_num<long,int,int(*)(char_const**,long*)>();
            goto LAB_001380c3;
          }
          puVar30 = puVar33 + 3;
          goto LAB_00137e70;
        }
        if (mVar1 == MP_INT) {
          iVar2 = bVar7 - 0xd0;
          val = &switchD_00137dd0::switchdataD_00140d7c;
          switch(iVar2) {
          case 0:
            uVar29 = (ulong)(char)puVar33[-1];
            break;
          case 1:
            uVar29 = (ulong)(short)(*(ushort *)(puVar33 + -1) << 8 | *(ushort *)(puVar33 + -1) >> 8)
            ;
            puVar30 = local_22f + lVar5 + -6;
            break;
          case 2:
            uVar15 = *(uint *)(puVar33 + -1);
            uVar29 = (ulong)(int)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8
                                 | uVar15 << 0x18);
            puVar30 = local_22f + lVar5 + -4;
            break;
          case 3:
            uVar29 = *(ulong *)(puVar33 + -1);
            uVar29 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                     (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                     (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                     (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
            puVar30 = local_22f + lVar5;
            break;
          default:
            if (bVar7 < 0xe0) {
              pcStack_270 = (code *)0x13808b;
              test_read_num<long,int,int(*)(char_const**,long*)>();
              goto LAB_0013808b;
            }
            uVar29 = uVar16;
            val = (uint *)pacVar11;
            puVar30 = local_22f + lVar5 + -8;
          }
          if (uVar29 != local_258) {
            pcStack_270 = (code *)0x1380e7;
            test_read_num<long,int,int(*)(char_const**,long*)>();
            goto LAB_001380e7;
          }
          goto LAB_00137f04;
        }
        if (bVar7 != 0xcb) {
LAB_001380c3:
          pcStack_270 = (code *)0x1380e2;
          __assert_fail("c == 0xcb",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x987,"double mp_decode_double(const char **)");
        }
        uVar29 = *(ulong *)(puVar33 + -1);
        dVar14 = (double)(uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                          (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                          (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                          (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38);
        if ((dVar14 == local_240) && (!NAN(dVar14) && !NAN(local_240))) {
          puVar30 = local_22f + lVar5;
          goto LAB_00137e70;
        }
        goto LAB_0013809a;
      }
      iVar2 = bVar7 - 0xcc;
      val = &switchD_00137e2e::switchdataD_00140d6c;
      switch(iVar2) {
      case 0:
        uVar29 = (ulong)(byte)puVar33[-1];
        break;
      case 1:
        uVar29 = (ulong)(ushort)(*(ushort *)(puVar33 + -1) << 8 | *(ushort *)(puVar33 + -1) >> 8);
        puVar30 = local_22f + lVar5 + -6;
        break;
      case 2:
        uVar15 = *(uint *)(puVar33 + -1);
        uVar29 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                        uVar15 << 0x18);
        puVar30 = local_22f + lVar5 + -4;
        break;
      case 3:
        uVar29 = *(ulong *)(puVar33 + -1);
        uVar29 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                 (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                 (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                 (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
        puVar30 = local_22f + lVar5;
        break;
      default:
        if (-1 < (char)bVar7) {
          val = (uint *)pacVar11;
          puVar30 = local_22f + lVar5 + -8;
          break;
        }
LAB_0013808b:
        pcStack_270 = (code *)0x138090;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_00138090;
      }
      if (uVar29 != local_258) {
LAB_001380e7:
        pcStack_270 = test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        builtin_strncpy(acStack_3a0,"typed read of ",0xf);
        pcStack_4d8 = (code *)0x138151;
        pacStack_4c0 = (char (*) [16])val;
        iStack_4b4 = iVar2;
        uStack_298 = uVar16;
        pcStack_290 = pcVar13;
        lStack_288 = lVar26;
        puStack_280 = puVar30;
        puStack_278 = puVar33;
        pcStack_270 = (code *)puVar8;
        iVar2 = snprintf(acStack_3a0 + 0xe,0xf2,"%llu",val);
        pcVar13 = acStack_3a0 + (long)iVar2 + 0xe;
        pcStack_4d8 = (code *)0x138175;
        iVar2 = snprintf(pcVar13,(size_t)(auStack_2a0 + -(long)pcVar13)," into ");
        pcStack_4d8 = (code *)0x138194;
        snprintf(pcVar13 + iVar2,(size_t)(auStack_2a0 + -(long)(pcVar13 + iVar2)),"int%zu_t",0x40);
        pcStack_4d8 = (code *)0x1381a3;
        _space((FILE *)_stdout);
        pcStack_4d8 = (code *)0x1381bc;
        fwrite("# ",2,1,_stdout);
        pcStack_4d8 = (code *)0x1381cc;
        fputs(acStack_3a0,_stdout);
        pcStack_4d8 = (code *)0x1381d9;
        fputc(10,_stdout);
        pacVar11 = (char (*) [16])&bStack_4a0;
        pcStack_4d8 = (code *)0x1381e6;
        pcVar25 = (char *)val;
        uVar15 = test_encode_uint_all_sizes(pacVar11,(uint64_t)val);
        if (-1 < (long)val) {
          pacVar11 = (char (*) [16])(&bStack_4a0 + (long)(int)uVar15 * 0x10);
          pcVar25 = (char *)0x7fffffffffffffff;
          pcStack_4d8 = (code *)0x13820b;
          iVar2 = test_encode_int_all_sizes(pacVar11,0x7fffffffffffffff);
          uVar15 = uVar15 + iVar2;
        }
        if ((int)uVar15 < 1) {
          return;
        }
        fStack_4c4 = (float)pacStack_4c0;
        auVar35._8_4_ = (int)((ulong)pacStack_4c0 >> 0x20);
        auVar35._0_8_ = pacStack_4c0;
        auVar35._12_4_ = 0x45300000;
        dStack_4a8 = auVar35._8_8_ - 1.9342813113834067e+25;
        dStack_4b0 = dStack_4a8 +
                     ((double)CONCAT44(0x43300000,(int)pacStack_4c0) - 4503599627370496.0);
        pcVar17 = (char *)(ulong)uVar15;
        pcVar27 = (char *)((long)&uStack_49f + 1);
        lVar26 = 0;
        goto LAB_00138274;
      }
LAB_00137f04:
      switch(bVar7) {
      case 0xcc:
        uVar16 = (ulong)(byte)puVar33[-1];
        goto LAB_00137f32;
      case 0xcd:
        puVar8 = local_22f + lVar5 + -6;
        uVar16 = (ulong)(ushort)(*(ushort *)(puVar33 + -1) << 8 | *(ushort *)(puVar33 + -1) >> 8);
        break;
      case 0xce:
        uVar15 = *(uint *)(puVar33 + -1);
        uVar16 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                        uVar15 << 0x18);
        puVar8 = local_22f + lVar5 + -4;
        break;
      case 0xcf:
        uVar29 = *(ulong *)(puVar33 + -1);
        uVar16 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                 (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                 (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                 (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
        if (-1 < (long)uVar16) goto LAB_00137f5c;
LAB_00137e70:
        uVar16 = 0;
        iVar2 = 0;
        goto LAB_00137faa;
      case 0xd0:
        uVar16 = (ulong)(char)puVar33[-1];
LAB_00137f32:
        puVar8 = local_22f + lVar5 + -7;
        break;
      case 0xd1:
        puVar8 = local_22f + lVar5 + -6;
        uVar16 = (ulong)(short)(*(ushort *)(puVar33 + -1) << 8 | *(ushort *)(puVar33 + -1) >> 8);
        break;
      case 0xd2:
        uVar15 = *(uint *)(puVar33 + -1);
        puVar8 = local_22f + lVar5 + -4;
        uVar16 = (ulong)(int)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                             uVar15 << 0x18);
        break;
      case 0xd3:
        uVar29 = *(ulong *)(puVar33 + -1);
        uVar16 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                 (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                 (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                 (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
LAB_00137f5c:
        puVar8 = local_22f + lVar5;
        break;
      default:
        if ((char)bVar7 < -0x20) goto LAB_00137e70;
        puVar8 = local_22f + lVar5 + -8;
      }
      iVar2 = 1;
LAB_00137faa:
      pcVar13 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      pcStack_270 = (code *)0x137fd2;
      _ok(iVar2,"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar7);
      pcStack_270 = (code *)0x137ff8;
      _ok((uint)(puVar30 == puVar8),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      if (local_25c < 0) {
        if (-1 < (long)uVar16) goto LAB_00138095;
        pcVar25 = "(int64_t)num1 == (int64_t)num2";
        iVar2 = 0x746;
      }
      else {
        if ((long)uVar16 < 0) {
LAB_00138090:
          pcStack_270 = (code *)0x138095;
          test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00138095:
          pcStack_270 = (code *)0x13809a;
          test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013809a:
          pcStack_270 = (code *)0x13809f;
          test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013809f:
          pcStack_270 = (code *)0x1380be;
          __assert_fail("c == 0xca",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x97e,"float mp_decode_float(const char **)");
        }
        pcVar25 = "(uint64_t)num1 == (uint64_t)num2";
        iVar2 = 0x743;
      }
      pacVar11 = (char (*) [16])(ulong)(uVar16 == local_258);
      pcStack_270 = (code *)0x13805f;
      _ok((uint)(uVar16 == local_258),pcVar25,
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          iVar2,"check int number");
      lVar26 = lVar26 + 1;
      puVar33 = puVar33 + 0x10;
      local_248 = local_248 - 1;
    } while (local_248 != 0);
  }
  return;
LAB_00138274:
  lVar5 = lVar26 * 0x10;
  pcVar23 = pcVar27 + -2;
  bVar7 = pcVar27[-2];
  pacVar10 = (char (*) [16])(ulong)bVar7;
  pacVar21 = (char (*) [16])(long)(char)bVar7;
  mVar1 = mp_type_hint[(long)pacVar10];
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar7 != 0xca) {
LAB_001385f4:
        pcStack_4d8 = (code *)0x138613;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar15 = *(uint *)(pcVar27 + -1);
      fVar12 = (float)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                      uVar15 << 0x18);
      if ((fVar12 == fStack_4c4) && (!NAN(fVar12) && !NAN(fStack_4c4))) {
        pcVar13 = pcVar27 + 3;
        goto LAB_0013837a;
      }
      pcStack_4d8 = (code *)0x138618;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00138618:
      pcStack_4d8 = (code *)0x13861d;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_0013861d;
    }
    if (mVar1 == MP_INT) {
      switch(bVar7) {
      case 0xd0:
        pacVar10 = (char (*) [16])(long)pcVar27[-1];
        pcVar25 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar13 = pcVar27;
        break;
      case 0xd1:
        pacVar10 = (char (*) [16])
                   (long)(short)(*(ushort *)(pcVar27 + -1) << 8 | *(ushort *)(pcVar27 + -1) >> 8);
        pcVar25 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar13 = acStack_497 + lVar5 + -6;
        break;
      case 0xd2:
        uVar15 = *(uint *)(pcVar27 + -1);
        pacVar10 = (char (*) [16])
                   (long)(int)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                              uVar15 << 0x18);
        pcVar25 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar13 = acStack_497 + lVar5 + -4;
        break;
      case 0xd3:
        uVar29 = *(ulong *)(pcVar27 + -1);
        pacVar10 = (char (*) [16])
                   (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                    (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                    (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                    (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38);
        pcVar25 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar13 = acStack_497 + lVar5;
        break;
      default:
        if (bVar7 < 0xe0) {
          pcStack_4d8 = (code *)0x1385c6;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_001385c6;
        }
        pacVar10 = pacVar21;
        pcVar13 = acStack_497 + lVar5 + -8;
      }
      if (pacVar10 != pacStack_4c0) goto LAB_00138618;
      goto LAB_0013840f;
    }
    if (bVar7 != 0xcb) goto LAB_001385d0;
    uVar29 = *(ulong *)(pcVar27 + -1);
    dVar14 = (double)(uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                      (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                      (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                      (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38);
    if ((dVar14 != dStack_4b0) || (NAN(dVar14) || NAN(dStack_4b0))) {
      pcStack_4d8 = (code *)0x1385f4;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_001385f4;
    }
    pcVar13 = acStack_497 + lVar5;
    goto LAB_0013837a;
  }
  switch(bVar7) {
  case 0xcc:
    pacVar10 = (char (*) [16])(ulong)(byte)pcVar27[-1];
    pcVar25 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar13 = pcVar27;
    break;
  case 0xcd:
    pacVar10 = (char (*) [16])
               (ulong)(ushort)(*(ushort *)(pcVar27 + -1) << 8 | *(ushort *)(pcVar27 + -1) >> 8);
    pcVar25 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar13 = acStack_497 + lVar5 + -6;
    break;
  case 0xce:
    uVar15 = *(uint *)(pcVar27 + -1);
    pacVar10 = (char (*) [16])
               (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                      uVar15 << 0x18);
    pcVar25 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar13 = acStack_497 + lVar5 + -4;
    break;
  case 0xcf:
    uVar29 = *(ulong *)(pcVar27 + -1);
    pacVar10 = (char (*) [16])
               (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 | (uVar29 & 0xff00) << 0x28
               | uVar29 << 0x38);
    pcVar25 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar13 = acStack_497 + lVar5;
    break;
  default:
    if (-1 < (char)bVar7) {
      pcVar13 = acStack_497 + lVar5 + -8;
      break;
    }
LAB_001385c6:
    pcStack_4d8 = (code *)0x1385cb;
    test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
    goto LAB_001385cb;
  }
  if (pacVar10 != pacStack_4c0) {
LAB_0013861d:
    pcStack_4d8 = test_read_num<double,int,int(*)(char_const**,double*)>;
    test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
    iVar2 = (int)pacVar11;
    builtin_strncpy(acStack_608,"typed read of ",0xf);
    pcStack_738 = (code *)(long)iVar2;
    if (iVar2 < 0) {
      pcVar23 = "%lld";
      pcVar9 = pcStack_738;
    }
    else {
      pcVar23 = "%llu";
      pcVar9 = (code *)((ulong)pacVar11 & 0xffffffff);
    }
    pcStack_740 = (code *)0x1386a4;
    pacStack_710 = (char (*) [16])pcVar25;
    pacStack_500 = (char (*) [16])pcVar17;
    pcStack_4f8 = pcVar13;
    pcStack_4f0 = pcVar27;
    pacStack_4e8 = (char (*) [16])val;
    lStack_4e0 = lVar26;
    pcStack_4d8 = (code *)(&bStack_4a0 + lVar5);
    iVar3 = snprintf(acStack_608 + 0xe,0xf2,pcVar23,pcVar9);
    pcVar13 = acStack_608 + 0xe + iVar3;
    iVar4 = 0;
    pcStack_740 = (code *)0x1386c3;
    iVar3 = snprintf(pcVar13,(size_t)(auStack_508 + -(long)pcVar13)," into ");
    puVar33 = auStack_508 + -(long)(pcVar13 + iVar3);
    pcStack_740 = (code *)0x1386dd;
    snprintf(pcVar13 + iVar3,(size_t)puVar33,"double");
    pcStack_740 = (code *)0x1386ec;
    _space((FILE *)_stdout);
    pcStack_740 = (code *)0x138705;
    fwrite("# ",2,1,_stdout);
    pcStack_740 = (code *)0x138715;
    fputs(acStack_608,_stdout);
    pcStack_740 = (code *)0x138722;
    fputc(10,_stdout);
    if (-1 < iVar2) {
      pcStack_740 = (code *)0x138733;
      iVar4 = test_encode_uint_all_sizes
                        ((char (*) [16])&bStack_708,(uint64_t)((ulong)pacVar11 & 0xffffffff));
    }
    pcVar25 = (char *)(&bStack_708 + (long)iVar4 * 0x10);
    pcStack_740 = (code *)0x138751;
    pcVar13 = (char *)pcStack_738;
    iVar3 = test_encode_int_all_sizes((char (*) [16])pcVar25,(int64_t)pcStack_738);
    uVar15 = iVar4 + iVar3;
    if (uVar15 == 0 || SCARRY4(iVar4,iVar3) != (int)uVar15 < 0) {
      return;
    }
    fStack_72c = (float)iVar2;
    dStack_728 = (double)iVar2;
    uVar29 = (ulong)uVar15;
    puVar28 = (undefined8 *)(auStack_707 + 1);
    pcVar27 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    lVar26 = 0;
    goto LAB_00138782;
  }
LAB_0013840f:
  switch(bVar7) {
  case 0xcc:
    pacVar21 = (char (*) [16])(ulong)(byte)pcVar27[-1];
    goto LAB_0013843d;
  case 0xcd:
    pcVar19 = acStack_497 + lVar5 + -6;
    pacVar21 = (char (*) [16])
               (ulong)(ushort)(*(ushort *)(pcVar27 + -1) << 8 | *(ushort *)(pcVar27 + -1) >> 8);
    break;
  case 0xce:
    uVar15 = *(uint *)(pcVar27 + -1);
    pacVar21 = (char (*) [16])
               (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                      uVar15 << 0x18);
    pcVar19 = acStack_497 + lVar5 + -4;
    break;
  case 0xcf:
    uVar29 = *(ulong *)(pcVar27 + -1);
    pacVar21 = (char (*) [16])
               (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 | (uVar29 & 0xff00) << 0x28
               | uVar29 << 0x38);
    if (-1 < (long)pacVar21) goto LAB_00138468;
LAB_0013837a:
    pacVar21 = (char (*) [16])0x0;
    iVar3 = 1;
    iVar2 = 0;
    pcVar19 = pcVar23;
    goto LAB_001384b7;
  case 0xd0:
    pacVar21 = (char (*) [16])(long)pcVar27[-1];
LAB_0013843d:
    pcVar19 = acStack_497 + lVar5 + -7;
    break;
  case 0xd1:
    pcVar19 = acStack_497 + lVar5 + -6;
    pacVar21 = (char (*) [16])
               (long)(short)(*(ushort *)(pcVar27 + -1) << 8 | *(ushort *)(pcVar27 + -1) >> 8);
    break;
  case 0xd2:
    uVar15 = *(uint *)(pcVar27 + -1);
    pcVar19 = acStack_497 + lVar5 + -4;
    pacVar21 = (char (*) [16])
               (long)(int)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                          uVar15 << 0x18);
    break;
  case 0xd3:
    uVar29 = *(ulong *)(pcVar27 + -1);
    pacVar21 = (char (*) [16])
               (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 | (uVar29 & 0xff00) << 0x28
               | uVar29 << 0x38);
LAB_00138468:
    pcVar19 = acStack_497 + lVar5;
    break;
  default:
    if ((char)bVar7 < -0x20) goto LAB_0013837a;
    pcVar19 = acStack_497 + lVar5 + -8;
  }
  iVar2 = 1;
  iVar3 = 0;
LAB_001384b7:
  if ((char)iStack_4b4 == '\0') {
    pcVar31 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4d8 = (code *)0x138579;
    _ok(iVar3,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar7);
    pacVar11 = (char (*) [16])(ulong)(pcVar23 == pcVar19);
    pcVar25 = "mp_num_pos2 == mp_nums[i]";
    pcStack_4d8 = (code *)0x13859f;
    _ok((uint)(pcVar23 == pcVar19),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  else {
    pcStack_4d8 = (code *)0x1384ef;
    _ok(iVar2,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar7);
    pcVar23 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4d8 = (code *)0x13851c;
    _ok((uint)(pcVar13 == pcVar19),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    if ((long)pacVar21 < 0) {
LAB_001385cb:
      pcStack_4d8 = (code *)0x1385d0;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_001385d0:
      pcStack_4d8 = (code *)0x1385ef;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    pacVar11 = (char (*) [16])(ulong)(pacVar21 == pacStack_4c0);
    pcVar25 = "(uint64_t)num1 == (uint64_t)num2";
    pcStack_4d8 = (code *)0x13854d;
    _ok((uint)(pacVar21 == pacStack_4c0),"(uint64_t)num1 == (uint64_t)num2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x743,"check int number");
    pcVar31 = pcVar17;
  }
  lVar26 = lVar26 + 1;
  pcVar27 = pcVar27 + 0x10;
  pcVar17 = pcVar17 + -1;
  pcVar13 = pcVar23;
  val = (uint *)pcVar31;
  if (pcVar17 == (char *)0x0) {
    return;
  }
  goto LAB_00138274;
LAB_00138782:
  lVar5 = lVar26 * 0x10;
  bVar7 = *(byte *)((long)puVar28 + -2);
  pcVar9 = (code *)(ulong)bVar7;
  mVar1 = mp_type_hint[(long)pcVar9];
  puVar18 = puVar28;
  if (mVar1 == MP_UINT) {
    switch(bVar7) {
    case 0xcc:
      pcVar9 = (code *)(ulong)*(byte *)((long)puVar28 + -1);
      break;
    case 0xcd:
      pcVar9 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar28 + -1) << 8 |
                                      *(ushort *)((long)puVar28 + -1) >> 8);
      puVar18 = (undefined8 *)((long)auStack_6ff + lVar5 + -6);
      break;
    case 0xce:
      uVar15 = *(uint *)((long)puVar28 + -1);
      pcVar9 = (code *)(ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                              uVar15 << 0x18);
      puVar18 = (undefined8 *)((long)auStack_6ff + lVar5 + -4);
      break;
    case 0xcf:
      uVar16 = *(ulong *)((long)puVar28 + -1);
      pcVar9 = (code *)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                        (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                        (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                        (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      puVar18 = auStack_6ff + lVar26 * 2;
      break;
    default:
      if ((char)bVar7 < '\0') {
LAB_001389dc:
        pcStack_740 = (code *)0x1389e1;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e1:
        pcStack_740 = (code *)0x1389e6;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e6:
        pcStack_740 = (code *)0x138a05;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar18 = auStack_6ff + lVar26 * 2 + -1;
    }
    if (pcVar9 != pcStack_738) {
      pcStack_740 = (code *)0x138a2e;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_00138a2e:
      pcStack_740 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_740 = (code *)0x1411a4;
      builtin_strncpy(acStack_870,"typed read of ",0xf);
      pcStack_9a8 = (code *)0x138a9a;
      uStack_98c = extraout_EDX;
      pcStack_978 = (code *)pcVar13;
      puStack_768 = puVar18;
      uStack_760 = uVar29;
      puStack_758 = puVar28;
      lStack_750 = lVar26;
      puStack_748 = puVar33;
      iVar2 = snprintf(acStack_870 + 0xe,0xf2,"%llu",pcVar25);
      pcVar13 = acStack_870 + (long)iVar2 + 0xe;
      pcStack_9a8 = (code *)0x138abe;
      iVar2 = snprintf(pcVar13,(size_t)(auStack_770 + -(long)pcVar13)," into ");
      pcStack_9a8 = (code *)0x138ad8;
      snprintf(pcVar13 + iVar2,(size_t)(auStack_770 + -(long)(pcVar13 + iVar2)),"double");
      pcStack_9a8 = (code *)0x138ae7;
      _space((FILE *)_stdout);
      pcStack_9a8 = (code *)0x138b00;
      fwrite("# ",2,1,_stdout);
      pcStack_9a8 = (code *)0x138b10;
      fputs(acStack_870,_stdout);
      pcStack_9a8 = (code *)0x138b1d;
      fputc(10,_stdout);
      pcStack_9a8 = (code *)0x138b2a;
      iVar2 = test_encode_uint_all_sizes((char (*) [16])&bStack_970,(uint64_t)pcVar25);
      pacVar11 = (char (*) [16])(&bStack_970 + (long)iVar2 * 0x10);
      pcStack_9a8 = (code *)0x138b48;
      pacStack_9a0 = (char (*) [16])pcVar25;
      iVar3 = test_encode_int_all_sizes(pacVar11,(int64_t)pcVar25);
      uVar15 = iVar2 + iVar3;
      if (uVar15 == 0 || SCARRY4(iVar2,iVar3) != (int)uVar15 < 0) {
        return;
      }
      fStack_990 = (float)(long)pacStack_9a0;
      dStack_988 = (double)(long)pacStack_9a0;
      uVar29 = (ulong)uVar15;
      pcVar17 = (char *)((long)&uStack_96f + 1);
      lVar26 = 0;
      goto LAB_00138b77;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar7 != 0xca) {
LAB_00138a0a:
      pcStack_740 = (code *)0x138a29;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar15 = *(uint *)((long)puVar28 + -1);
    fVar12 = (float)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                    uVar15 << 0x18);
    if ((fVar12 != fStack_72c) || (NAN(fVar12) || NAN(fStack_72c))) goto LAB_001389e1;
    puVar18 = (undefined8 *)((long)puVar28 + 3);
  }
  else if (mVar1 == MP_INT) {
    pcVar9 = (code *)(long)(char)bVar7;
    switch(bVar7) {
    case 0xd0:
      pcVar9 = (code *)(long)*(char *)((long)puVar28 + -1);
      pcVar13 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd1:
      pcVar9 = (code *)(long)(short)(*(ushort *)((long)puVar28 + -1) << 8 |
                                    *(ushort *)((long)puVar28 + -1) >> 8);
      puVar18 = (undefined8 *)((long)auStack_6ff + lVar5 + -6);
      pcVar13 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd2:
      uVar15 = *(uint *)((long)puVar28 + -1);
      pcVar9 = (code *)(long)(int)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 |
                                   (uVar15 & 0xff00) << 8 | uVar15 << 0x18);
      puVar18 = (undefined8 *)((long)auStack_6ff + lVar5 + -4);
      pcVar13 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd3:
      uVar16 = *(ulong *)((long)puVar28 + -1);
      pcVar9 = (code *)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                        (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                        (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                        (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      puVar18 = auStack_6ff + lVar26 * 2;
      pcVar13 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    default:
      if (bVar7 < 0xe0) {
        pcStack_740 = (code *)0x1389dc;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001389dc;
      }
      puVar18 = auStack_6ff + lVar26 * 2 + -1;
    }
    if (pcVar9 != pcStack_738) goto LAB_00138a2e;
  }
  else {
    if (bVar7 != 0xcb) goto LAB_001389e6;
    uVar16 = *(ulong *)((long)puVar28 + -1);
    dVar14 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar14 != dStack_728) || (NAN(dVar14) || NAN(dStack_728))) {
      pcStack_740 = (code *)0x138a0a;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_00138a0a;
    }
    puVar18 = auStack_6ff + lVar26 * 2;
  }
  puStack_718 = (undefined8 *)((long)puVar28 + -2);
  puVar33 = (undefined1 *)(ulong)(uint)(int)(char)bVar7;
  dStack_720 = 0.0;
  pcStack_740 = (code *)0x138922;
  iVar2 = (*(code *)pacStack_710)(&puStack_718,&dStack_720);
  pcStack_740 = (code *)0x13894a;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar33);
  pcStack_740 = (code *)0x138972;
  _ok((uint)(puVar18 == puStack_718),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar34 = ABS(dStack_728 - dStack_720) < 1e-15;
  pcVar25 = (char *)(ulong)bVar34;
  pcVar13 = "double_eq(num1, num2)";
  pcStack_740 = (code *)0x1389b5;
  _ok((uint)bVar34,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar26 = lVar26 + 1;
  puVar28 = puVar28 + 2;
  uVar29 = uVar29 - 1;
  if (uVar29 == 0) {
    return;
  }
  goto LAB_00138782;
LAB_00138b77:
  lVar5 = lVar26 * 0x10;
  bVar7 = pcVar17[-2];
  pacVar10 = (char (*) [16])(ulong)bVar7;
  mVar1 = mp_type_hint[(long)pacVar10];
  pcVar23 = pcVar17;
  if (mVar1 == MP_UINT) {
    switch(bVar7) {
    case 0xcc:
      pacVar10 = (char (*) [16])(ulong)(byte)pcVar17[-1];
      break;
    case 0xcd:
      pacVar10 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
      pcVar23 = acStack_967 + lVar5 + -6;
      break;
    case 0xce:
      uVar15 = *(uint *)(pcVar17 + -1);
      pacVar10 = (char (*) [16])
                 (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                        uVar15 << 0x18);
      pcVar23 = acStack_967 + lVar5 + -4;
      break;
    case 0xcf:
      uVar16 = *(ulong *)(pcVar17 + -1);
      pacVar10 = (char (*) [16])
                 (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                  (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                  (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                  (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar23 = acStack_967 + lVar26 * 0x10;
      break;
    default:
      if ((char)bVar7 < '\0') {
LAB_00138e36:
        pcStack_9a8 = (code *)0x138e3b;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e3b:
        pcStack_9a8 = (code *)0x138e40;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e40:
        pcStack_9a8 = (code *)0x138e5f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar23 = acStack_967 + (lVar26 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_9a0) {
      pcStack_9a8 = (code *)0x138e88;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e88:
      pcStack_9a8 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_bd8,"typed read of ",0xf);
      pcStack_c10 = (code *)0x138ef1;
      uStack_bf4 = extraout_EDX_00;
      pacStack_be0 = (char (*) [16])pcVar25;
      lStack_9d0 = lVar26;
      uStack_9c8 = uVar29;
      pcStack_9c0 = pcVar13;
      pcStack_9b8 = pcVar23;
      pcStack_9b0 = pcVar17;
      pcStack_9a8 = (code *)pcVar27;
      iVar2 = snprintf(acStack_bd8 + 0xe,0xf2,"%lld",pacVar11);
      pcVar13 = acStack_bd8 + (long)iVar2 + 0xe;
      pcStack_c10 = (code *)0x138f12;
      iVar2 = snprintf(pcVar13,(size_t)(&bStack_ad8 + -(long)pcVar13)," into ");
      pcStack_c10 = (code *)0x138f2c;
      snprintf(pcVar13 + iVar2,(size_t)(&bStack_ad8 + -(long)(pcVar13 + iVar2)),"double");
      pcStack_c10 = (code *)0x138f3b;
      _space((FILE *)_stdout);
      pcStack_c10 = (code *)0x138f54;
      fwrite("# ",2,1,_stdout);
      pcStack_c10 = (code *)0x138f61;
      fputs(acStack_bd8,_stdout);
      pcStack_c10 = (code *)0x138f6e;
      fputc(10,_stdout);
      pacVar10 = (char (*) [16])&bStack_ad8;
      pcStack_c10 = (code *)0x138f82;
      pacStack_c08 = pacVar11;
      uVar15 = test_encode_int_all_sizes(pacVar10,(int64_t)pacVar11);
      if ((int)uVar15 < 1) {
        return;
      }
      fStack_bf8 = (float)(long)pacStack_c08;
      dStack_bf0 = (double)(long)pacStack_c08;
      uVar29 = (ulong)uVar15;
      pcVar25 = (char *)((long)&uStack_ad7 + 1);
      lVar26 = 0;
      goto LAB_00138fb4;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar7 != 0xca) {
LAB_00138e64:
      pcStack_9a8 = (code *)0x138e83;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar15 = *(uint *)(pcVar17 + -1);
    fVar12 = (float)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                    uVar15 << 0x18);
    if ((fVar12 != fStack_990) || (NAN(fVar12) || NAN(fStack_990))) goto LAB_00138e3b;
    pcVar23 = pcVar17 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar10 = (char (*) [16])(long)(char)bVar7;
    switch(bVar7) {
    case 0xd0:
      pacVar10 = (char (*) [16])(long)pcVar17[-1];
      pcVar25 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      break;
    case 0xd1:
      pacVar10 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
      pcVar25 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar23 = acStack_967 + lVar5 + -6;
      break;
    case 0xd2:
      uVar15 = *(uint *)(pcVar17 + -1);
      pacVar10 = (char (*) [16])
                 (long)(int)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                            uVar15 << 0x18);
      pcVar25 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar23 = acStack_967 + lVar5 + -4;
      break;
    case 0xd3:
      uVar16 = *(ulong *)(pcVar17 + -1);
      pacVar10 = (char (*) [16])
                 (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                  (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                  (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                  (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar25 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar23 = acStack_967 + lVar26 * 0x10;
      break;
    default:
      if (bVar7 < 0xe0) {
        pcStack_9a8 = (code *)0x138e36;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00138e36;
      }
      pcVar23 = acStack_967 + (lVar26 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_9a0) goto LAB_00138e88;
  }
  else {
    if (bVar7 != 0xcb) goto LAB_00138e40;
    uVar16 = *(ulong *)(pcVar17 + -1);
    dVar14 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar14 != dStack_988) || (NAN(dVar14) || NAN(dStack_988))) {
      pcStack_9a8 = (code *)0x138e64;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00138e64;
    }
    pcVar23 = acStack_967 + lVar26 * 0x10;
  }
  pcVar27 = pcVar17 + -2;
  pcVar13 = (char *)(ulong)(uint)(int)(char)bVar7;
  dStack_980 = 0.0;
  pcStack_9a8 = (code *)0x138d17;
  pcStack_998 = pcVar27;
  iVar2 = (*pcStack_978)(&pcStack_998,&dStack_980);
  if ((char)uStack_98c == '\0') {
    pcStack_9a8 = (code *)0x138de7;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar13);
    bVar34 = pcVar27 == pcStack_998;
    pcVar25 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    pcVar23 = "check position";
  }
  else {
    pcVar27 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_9a8 = (code *)0x138d51;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar13);
    pcStack_9a8 = (code *)0x138d79;
    _ok((uint)(pcVar23 == pcStack_998),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar34 = ABS(dStack_988 - dStack_980) < 1e-15;
    pcVar25 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    pcVar23 = "check float number";
  }
  pacVar11 = (char (*) [16])(ulong)bVar34;
  pcStack_9a8 = (code *)0x138e0f;
  _ok((uint)bVar34,pcVar25,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      pcVar23);
  lVar26 = lVar26 + 1;
  pcVar17 = pcVar17 + 0x10;
  uVar29 = uVar29 - 1;
  if (uVar29 == 0) {
    return;
  }
  goto LAB_00138b77;
LAB_00138fb4:
  lVar5 = lVar26 * 0x10;
  bVar7 = pcVar25[-2];
  pacVar11 = (char (*) [16])(ulong)bVar7;
  mVar1 = mp_type_hint[(long)pacVar11];
  pcVar17 = pcVar25;
  if (mVar1 == MP_UINT) {
    switch(bVar7) {
    case 0xcc:
      pacVar11 = (char (*) [16])(ulong)(byte)pcVar25[-1];
      break;
    case 0xcd:
      pacVar11 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar25 + -1) << 8 | *(ushort *)(pcVar25 + -1) >> 8);
      pcVar17 = acStack_acf + lVar5 + -6;
      break;
    case 0xce:
      uVar15 = *(uint *)(pcVar25 + -1);
      pacVar11 = (char (*) [16])
                 (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                        uVar15 << 0x18);
      pcVar17 = acStack_acf + lVar5 + -4;
      break;
    case 0xcf:
      uVar16 = *(ulong *)(pcVar25 + -1);
      pacVar11 = (char (*) [16])
                 (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                  (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                  (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                  (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar17 = acStack_acf + lVar26 * 0x10;
      break;
    default:
      if ((char)bVar7 < '\0') {
LAB_00139276:
        pcStack_c10 = (code *)0x13927b;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_0013927b:
        pcStack_c10 = (code *)0x139280;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00139280:
        pcStack_c10 = (code *)0x13929f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar17 = acStack_acf + (lVar26 * 2 + -1) * 8;
    }
    if (pacVar11 != pacStack_c08) {
      pcStack_c10 = (code *)0x1392c8;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_001392c8:
      pcStack_c10 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_e40,"typed read of ",0xf);
      uVar24 = CONCAT71((int7)(uVar29 >> 8),1);
      pcStack_e58 = (code *)0x13932e;
      lStack_c38 = lVar26;
      uStack_c30 = uVar29;
      pcStack_c28 = pcVar13;
      pcStack_c20 = pcVar17;
      pcStack_c18 = pcVar25;
      pcStack_c10 = (code *)pcVar27;
      iVar2 = snprintf(acStack_e40 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar13 = acStack_e40 + (long)iVar2 + 0xe;
      pcStack_e58 = (code *)0x13934f;
      iVar2 = snprintf(pcVar13,(size_t)(abStack_d40 + -(long)pcVar13)," into ");
      pcStack_e58 = (code *)0x139369;
      snprintf(pcVar13 + iVar2,(size_t)(abStack_d40 + -(long)(pcVar13 + iVar2)),"double");
      puVar32 = &stdout;
      pcStack_e58 = (code *)0x139378;
      _space((FILE *)_stdout);
      pcStack_e58 = (code *)0x139391;
      fwrite("# ",2,1,_stdout);
      pcStack_e58 = (code *)0x13939e;
      fputs(acStack_e40,_stdout);
      pcVar9 = (code *)0xa;
      pcStack_e58 = (code *)0x1393ab;
      fputc(10,_stdout);
      abStack_d40[0] = 0xca;
      abStack_d40[1] = 0x4a;
      abStack_d40[2] = 200;
      abStack_d40[3] = 0x59;
      abStack_d40[4] = 0x10;
      abStack_d30[0] = 0xcb;
      abStack_d30[1] = 0x41;
      abStack_d30[2] = 0x59;
      abStack_d30[3] = 0xb;
      abStack_d30[4] = 0x22;
      abStack_d30[5] = 0;
      abStack_d30[6] = 0;
      abStack_d30[7] = 0;
      abStack_d30[8] = 0;
      pbVar6 = abStack_d40;
      goto LAB_001393db;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar7 != 0xca) {
LAB_001392a4:
      pcStack_c10 = (code *)0x1392c3;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar15 = *(uint *)(pcVar25 + -1);
    fVar12 = (float)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                    uVar15 << 0x18);
    if ((fVar12 != fStack_bf8) || (NAN(fVar12) || NAN(fStack_bf8))) goto LAB_0013927b;
    pcVar17 = pcVar25 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar11 = (char (*) [16])(long)(char)bVar7;
    switch(bVar7) {
    case 0xd0:
      pacVar11 = (char (*) [16])(long)pcVar25[-1];
      break;
    case 0xd1:
      pacVar11 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar25 + -1) << 8 | *(ushort *)(pcVar25 + -1) >> 8);
      pcVar17 = acStack_acf + lVar5 + -6;
      break;
    case 0xd2:
      uVar15 = *(uint *)(pcVar25 + -1);
      pacVar11 = (char (*) [16])
                 (long)(int)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                            uVar15 << 0x18);
      pcVar17 = acStack_acf + lVar5 + -4;
      break;
    case 0xd3:
      uVar16 = *(ulong *)(pcVar25 + -1);
      pacVar11 = (char (*) [16])
                 (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                  (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                  (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                  (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar17 = acStack_acf + lVar26 * 0x10;
      break;
    default:
      if (bVar7 < 0xe0) {
        pcStack_c10 = (code *)0x139276;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00139276;
      }
      pcVar17 = acStack_acf + (lVar26 * 2 + -1) * 8;
    }
    if (pacVar11 != pacStack_c08) goto LAB_001392c8;
  }
  else {
    if (bVar7 != 0xcb) goto LAB_00139280;
    uVar16 = *(ulong *)(pcVar25 + -1);
    dVar14 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar14 != dStack_bf0) || (NAN(dVar14) || NAN(dStack_bf0))) {
      pcStack_c10 = (code *)0x1392a4;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_001392a4;
    }
    pcVar17 = acStack_acf + lVar26 * 0x10;
  }
  pcVar27 = pcVar25 + -2;
  pcVar13 = (char *)(ulong)(uint)(int)(char)bVar7;
  dStack_be8 = 0.0;
  pcStack_c10 = (code *)0x139157;
  pcStack_c00 = pcVar27;
  iVar2 = (*(code *)pacStack_be0)(&pcStack_c00,&dStack_be8);
  if ((char)uStack_bf4 == '\0') {
    pcStack_c10 = (code *)0x139227;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar13);
    bVar34 = pcVar27 == pcStack_c00;
    pcVar17 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    pcVar23 = "check position";
  }
  else {
    pcVar27 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_c10 = (code *)0x139191;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar13);
    pcStack_c10 = (code *)0x1391b9;
    _ok((uint)(pcVar17 == pcStack_c00),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar34 = ABS(dStack_bf0 - dStack_be8) < 1e-15;
    pcVar17 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    pcVar23 = "check float number";
  }
  pacVar10 = (char (*) [16])(ulong)bVar34;
  pcStack_c10 = (code *)0x13924f;
  _ok((uint)bVar34,pcVar17,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      pcVar23);
  lVar26 = lVar26 + 1;
  pcVar25 = pcVar25 + 0x10;
  uVar29 = uVar29 - 1;
  if (uVar29 == 0) {
    return;
  }
  goto LAB_00138fb4;
LAB_001393db:
  bVar7 = *pbVar6;
  uVar29 = (ulong)bVar7;
  mVar1 = mp_type_hint[uVar29];
  if (mVar1 == MP_UINT) {
    if (bVar7 == 0xce) {
      uVar15 = *(uint *)(pbVar6 + 1);
      uVar16 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                      uVar15 << 0x18);
      pbVar20 = pbVar6 + 5;
LAB_001394a6:
      if (uVar16 == 0x642c88) goto LAB_001394cd;
    }
    else {
      if (bVar7 == 0xcf) {
        uVar16 = *(ulong *)(pbVar6 + 1);
        uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
        pbVar20 = pbVar6 + 9;
        goto LAB_001394a6;
      }
      if ((1 < bVar7 - 0xcc) && ((char)bVar7 < '\0')) {
        pcStack_e58 = (code *)0x139617;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00139617;
      }
    }
    pcStack_e58 = (code *)0x1395b5;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    bVar7 = (byte)uVar29;
    uVar15 = extraout_EDX_01;
LAB_001395b5:
    if ((1 < uVar15 - 0xd0) && (bVar7 < 0xe0)) {
LAB_00139617:
      pcStack_e58 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1078,"typed read of ",0xf);
      pacStack_e70 = pacVar10;
      uStack_e68 = uVar24;
      puStack_e60 = puVar32;
      pcStack_e58 = (code *)abStack_d30;
      iVar2 = snprintf(acStack_1078 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar13 = acStack_1078 + (long)iVar2 + 0xe;
      iVar2 = snprintf(pcVar13,(size_t)(&uStack_f78 + -(long)pcVar13)," into ");
      snprintf(pcVar13 + iVar2,(size_t)(&uStack_f78 + -(long)(pcVar13 + iVar2)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_1078,_stdout);
      fputc(10,_stdout);
      puStack_1080 = &uStack_f78;
      uStack_f78 = 0xcb;
      uStack_f77 = 0xb81e85eb513816c0;
      dStack_1088 = 0.0;
      iVar2 = (*pcVar9)(&puStack_1080,&dStack_1088);
      _ok((uint)(iVar2 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_f6f == puStack_1080),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_1088) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
LAB_001395c5:
    pcStack_e58 = (code *)0x1395ca;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395ca:
    pcStack_e58 = (code *)0x1395cf;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395cf:
    pcStack_e58 = (code *)0x1395ee;
    __assert_fail("c == 0xcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x987,"double mp_decode_double(const char **)");
  }
  if (mVar1 == MP_FLOAT) {
    if (bVar7 != 0xca) {
LAB_001395f3:
      pcStack_e58 = (code *)0x139612;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar15 = *(uint *)(pbVar6 + 1);
    fVar12 = (float)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                    uVar15 << 0x18);
    if ((fVar12 == 6.565e+06) && (!NAN(fVar12))) {
      pbVar20 = pbVar6 + 5;
      goto LAB_001394cd;
    }
    goto LAB_001395ca;
  }
  if (mVar1 == MP_INT) {
    if (bVar7 != 0xd2) {
      uVar15 = (uint)bVar7;
      if (bVar7 == 0xd3) {
        uVar29 = *(ulong *)(pbVar6 + 1);
        uVar29 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                 (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                 (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                 (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
        pbVar20 = pbVar6 + 9;
        goto LAB_001394c0;
      }
      goto LAB_001395b5;
    }
    uVar15 = *(uint *)(pbVar6 + 1);
    pbVar20 = pbVar6 + 5;
    uVar29 = (ulong)(int)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                         uVar15 << 0x18);
LAB_001394c0:
    if (uVar29 == 0x642c88) goto LAB_001394cd;
    goto LAB_001395c5;
  }
  if (bVar7 != 0xcb) goto LAB_001395cf;
  uVar29 = *(ulong *)(pbVar6 + 1);
  dVar14 = (double)(uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                    (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                    (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                    (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38);
  if ((dVar14 != 6565000.0) || (NAN(dVar14))) {
    pcStack_e58 = (code *)0x1395f3;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    goto LAB_001395f3;
  }
  pbVar20 = pbVar6 + 9;
LAB_001394cd:
  puVar32 = (undefined *)(ulong)(uint)(int)(char)bVar7;
  dStack_e50 = 0.0;
  pcStack_e58 = (code *)0x1394e8;
  pbStack_e48 = pbVar6;
  iVar2 = (*(code *)pacVar10)(&pbStack_e48,&dStack_e50);
  pcStack_e58 = (code *)0x139510;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar32);
  pcStack_e58 = (code *)0x139538;
  _ok((uint)(pbVar20 == pbStack_e48),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar34 = ABS(6565000.0 - dStack_e50) < 1e-15;
  pcVar9 = (code *)(ulong)bVar34;
  pcStack_e58 = (code *)0x13957c;
  _ok((uint)bVar34,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  cVar22 = (char)uVar24;
  uVar24 = 0;
  pbVar6 = abStack_d30;
  if (cVar22 == '\0') {
    return;
  }
  goto LAB_001393db;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}